

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  ushort uVar1;
  long lVar2;
  sqlite3 *psVar3;
  Mem *pMVar4;
  uint uVar5;
  Vdbe *pVVar6;
  char cVar7;
  uchar uVar8;
  int nName;
  long lVar9;
  char *pcVar10;
  long lVar11;
  uchar *puVar12;
  int iVar13;
  ulong uVar14;
  int nTotal;
  int iVar15;
  long in_FS_OFFSET;
  int idx;
  StrAccum out;
  int tokenType;
  Vdbe *local_f8;
  sqlite3 *local_f0;
  Mem utf8;
  char zBase [100];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  idx = 0;
  psVar3 = p->db;
  out.mxAlloc = psVar3->aLimit[0];
  out.zBase = zBase;
  out.db = (sqlite3 *)0x0;
  out.nChar = 0;
  out.nAlloc = 100;
  out.accError = '\0';
  out.printfFlags = '\0';
  out.zText = out.zBase;
  if (psVar3->nVdbeExec < 2) {
    if (p->nVar == 0) {
      iVar13 = sqlite3Strlen30(zRawSql);
      sqlite3StrAccumAppend(&out,zRawSql,iVar13);
    }
    else {
      iVar13 = 1;
      local_f8 = p;
      local_f0 = psVar3;
      while (*zRawSql != '\0') {
        uVar8 = '\x01';
        iVar15 = 0;
        puVar12 = (uchar *)zRawSql;
        while ((nName = 0, uVar8 != '\0' &&
               (nName = sqlite3GetToken(puVar12,&tokenType), tokenType != 0x87))) {
          iVar15 = iVar15 + nName;
          uVar8 = puVar12[nName];
          puVar12 = puVar12 + nName;
        }
        sqlite3StrAccumAppend(&out,zRawSql,iVar15);
        pVVar6 = local_f8;
        if (nName == 0) break;
        puVar12 = (uchar *)zRawSql + iVar15;
        if (*puVar12 == '?') {
          if (1 < nName) {
            sqlite3GetInt32((char *)(puVar12 + 1),&idx);
            iVar13 = idx;
          }
        }
        else {
          iVar13 = sqlite3VdbeParameterIndex(local_f8,(char *)puVar12,nName);
        }
        idx = iVar13;
        zRawSql = (char *)(puVar12 + nName);
        pMVar4 = pVVar6->aVar;
        lVar9 = (long)idx;
        iVar13 = idx + 1;
        uVar1 = pMVar4[lVar9 + -1].flags;
        if ((uVar1 & 1) == 0) {
          if ((uVar1 & 4) == 0) {
            if ((uVar1 & 8) == 0) {
              if ((uVar1 & 2) == 0) {
                if ((uVar1 >> 0xe & 1) == 0) {
                  sqlite3StrAccumAppend(&out,"x\'",2);
                  uVar5 = pMVar4[lVar9 + -1].n;
                  if (pMVar4[lVar9 + -1].n < 1) {
                    uVar5 = 0;
                  }
                  for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
                    sqlite3XPrintf(&out,"%02x",(ulong)(byte)pMVar4[lVar9 + -1].z[uVar14]);
                  }
                  sqlite3StrAccumAppend(&out,"\'",1);
                }
                else {
                  sqlite3XPrintf(&out,"zeroblob(%d)",(ulong)(uint)pMVar4[lVar9 + -1].u.nZero);
                }
              }
              else if (local_f0->enc == '\x01') {
                sqlite3XPrintf(&out,"\'%.*q\'",(ulong)(uint)pMVar4[lVar9 + -1].n,
                               pMVar4[lVar9 + -1].z);
              }
              else {
                utf8.szMalloc = 0;
                utf8.uTemp = 0;
                utf8.z = (char *)0x0;
                utf8.zMalloc = (char *)0x0;
                utf8.xDel = (_func_void_void_ptr *)0x0;
                utf8.u.r = 0.0;
                utf8.flags = 0;
                utf8.enc = '\0';
                utf8.eSubtype = '\0';
                utf8.n = 0;
                utf8.db = local_f0;
                sqlite3VdbeMemSetStr
                          (&utf8,pMVar4[lVar9 + -1].z,pMVar4[lVar9 + -1].n,local_f0->enc,
                           (_func_void_void_ptr *)0x0);
                iVar15 = sqlite3VdbeChangeEncoding(&utf8,1);
                if (iVar15 == 7) {
                  out.accError = '\x01';
                  out._24_8_ = out._24_8_ & 0xffffffff;
                }
                sqlite3XPrintf(&out,"\'%.*q\'",(ulong)utf8._8_8_ >> 0x20,utf8.z);
                sqlite3VdbeMemRelease(&utf8);
              }
            }
            else {
              sqlite3XPrintf(&out,"%!.15g",pMVar4[lVar9 + -1].u.nZero);
            }
          }
          else {
            sqlite3XPrintf(&out,"%lld",pMVar4[lVar9 + -1].u.r);
          }
        }
        else {
          sqlite3StrAccumAppend(&out,"NULL",4);
        }
      }
    }
  }
  else {
    for (; cVar7 = *zRawSql, lVar9 = 1, cVar7 != '\0'; zRawSql = zRawSql + lVar11) {
      do {
        lVar11 = lVar9;
        if (cVar7 == '\n') break;
        cVar7 = zRawSql[lVar11];
        lVar9 = lVar11 + 1;
      } while (cVar7 != '\0');
      sqlite3StrAccumAppend(&out,"-- ",3);
      sqlite3StrAccumAppend(&out,zRawSql,(int)lVar11);
    }
  }
  if (out.accError != '\0') {
    sqlite3StrAccumReset(&out);
  }
  pcVar10 = sqlite3StrAccumFinish(&out);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return pcVar10;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 parameters into UTF8 for display */
#endif
  char zBase[100];         /* Initial working space */

  db = p->db;
  sqlite3StrAccumInit(&out, 0, zBase, sizeof(zBase), 
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3StrAccumAppend(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3StrAccumAppend(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3StrAccumAppend(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3StrAccumAppend(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = idx + 1;
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3StrAccumAppend(&out, "NULL", 4);
      }else if( pVar->flags & MEM_Int ){
        sqlite3XPrintf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3XPrintf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = STRACCUM_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif    
        sqlite3XPrintf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3XPrintf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3XPrintf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3StrAccumAppend(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3XPrintf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3StrAccumAppend(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3XPrintf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3StrAccumReset(&out);
  return sqlite3StrAccumFinish(&out);
}